

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O0

SharedDispatcher __thiscall
AmsConnection::CreateNotifyMapping
          (AmsConnection *this,uint32_t hNotify,shared_ptr<Notification> *notification)

{
  uint32_t hNotify_00;
  element_type *this_00;
  element_type *this_01;
  __shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  SharedDispatcher SVar1;
  shared_ptr<Notification> local_50 [2];
  undefined1 local_29;
  shared_ptr<Notification> *notification_local;
  VirtualConnection *pVStack_18;
  uint32_t hNotify_local;
  AmsConnection *this_local;
  SharedDispatcher *dispatcher;
  
  notification_local._4_4_ = (uint32_t)notification;
  local_29 = 0;
  pVStack_18 = (VirtualConnection *)CONCAT44(in_register_00000034,hNotify);
  this_local = this;
  std::__shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_RCX);
  DispatcherListAdd(this,(VirtualConnection *)CONCAT44(in_register_00000034,hNotify));
  this_00 = std::__shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(in_RCX);
  Notification::hNotify(this_00,notification_local._4_4_);
  this_01 = std::
            __shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  hNotify_00 = notification_local._4_4_;
  std::shared_ptr<Notification>::shared_ptr(local_50,(shared_ptr<Notification> *)in_RCX);
  NotificationDispatcher::Emplace(this_01,hNotify_00,local_50);
  std::shared_ptr<Notification>::~shared_ptr(local_50);
  SVar1.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedDispatcher)
         SVar1.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedDispatcher AmsConnection::CreateNotifyMapping(uint32_t hNotify, std::shared_ptr<Notification> notification)
{
    auto dispatcher = DispatcherListAdd(notification->connection);
    notification->hNotify(hNotify);
    dispatcher->Emplace(hNotify, notification);
    return dispatcher;
}